

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_sct_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  
  bVar1 = true;
  if (contents != (CBS *)0x0) {
    if (contents->len == 0) {
      hs->field_0x6c8 = hs->field_0x6c8 | 4;
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ext_sct_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->scts_requested = true;
  return true;
}